

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

int __thiscall Lodtalk::StackInterpreterProxy::returnTop(StackInterpreterProxy *this)

{
  StackInterpreter::returnTop(this->interpreter);
  return 0;
}

Assistant:

int StackInterpreterProxy::returnTop()
{
    interpreter->returnTop();
    return 0;
}